

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HastTest.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  thread secondThread;
  thread firstThread;
  HashMap<int,_int,_std::hash<int>_> integerMap;
  reference_wrapper<CTSL::HashMap<int,_int,_std::hash<int>_>_> local_48;
  thread local_40;
  reference_wrapper<CTSL::HashMap<int,_int,_std::hash<int>_>_> local_38;
  HashMap<int,_int,_std::hash<int>_> local_30;
  
  testSingleThreadStringKey();
  testSingleThreadIntegerKey();
  local_30.hashSize = 0x407;
  puVar1 = (undefined8 *)operator_new__(0x101c8);
  *puVar1 = 0x407;
  memset((HashBucket<int,_int> *)(puVar1 + 1),0,0x101c0);
  local_48._M_data = &local_30;
  local_30.hashTable = (HashBucket<int,_int> *)(puVar1 + 1);
  std::thread::
  thread<void(&)(CTSL::HashMap<int,int,std::hash<int>>&),std::reference_wrapper<CTSL::HashMap<int,int,std::hash<int>>>,void>
            (&local_40,testMultiThreadIntegerKey_Func1,&local_48);
  local_38._M_data = &local_30;
  std::thread::
  thread<void(&)(CTSL::HashMap<int,int,std::hash<int>>&),std::reference_wrapper<CTSL::HashMap<int,int,std::hash<int>>>,void>
            ((thread *)&local_48,testMultiThreadIntegerKey_Func2,&local_38);
  std::thread::join();
  std::thread::join();
  if ((local_48._M_data == (HashMap<int,_int,_std::hash<int>_> *)0x0) &&
     (local_40._M_id._M_thread == 0)) {
    CTSL::HashMap<int,_int,_std::hash<int>_>::~HashMap(&local_30);
    return 0;
  }
  std::terminate();
}

Assistant:

int main()
{
  testSingleThread(); // Single threaded test

  // Multi threaded test with two threads
  CTSL::HashMap<int, int> integerMap;
  std::thread firstThread(testMultiThreadIntegerKey_Func1, ref(integerMap));
  std::thread secondThread(testMultiThreadIntegerKey_Func2, ref(integerMap));

  firstThread.join();
  secondThread.join();

  return 0;
}